

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O3

void __thiscall Fl_File_Chooser::showChoiceCB(Fl_File_Chooser *this)

{
  Fl_Menu_Item *pFVar1;
  Fl_Menu_Item *pFVar2;
  char *__s1;
  Fl_Menu_ *this_00;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  int dstsize;
  char temp [2048];
  char acStack_818 [2048];
  
  pcVar5 = custom_filter_label;
  pFVar1 = (this->showChoice->super_Fl_Menu_).menu_;
  pFVar2 = (this->showChoice->super_Fl_Menu_).value_;
  if (pFVar2 == (Fl_Menu_Item *)0x0) {
    lVar6 = -1;
  }
  else {
    lVar6 = (long)((int)((ulong)((long)pFVar2 - (long)pFVar1) >> 3) * -0x49249249);
  }
  __s1 = pFVar1[lVar6].text;
  iVar3 = strcmp(__s1,custom_filter_label);
  if (iVar3 == 0) {
    pcVar5 = fl_input("%s",this->pattern_,pcVar5);
    if (pcVar5 != (char *)0x0) {
      fl_strlcpy(this->pattern_,pcVar5,0x800);
      quote_pathname(acStack_818,pcVar5,dstsize);
      Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,acStack_818);
      this_00 = &this->showChoice->super_Fl_Menu_;
      iVar3 = Fl_Menu_::size(this_00);
      Fl_Choice::value((Fl_Choice *)this_00,iVar3 + -2);
    }
  }
  else {
    pcVar4 = strchr(__s1,0x28);
    pcVar5 = this->pattern_;
    if (pcVar4 == (char *)0x0) {
      fl_strlcpy(pcVar5,__s1,0x800);
    }
    else {
      fl_strlcpy(pcVar5,pcVar4 + 1,0x800);
      pcVar5 = strrchr(pcVar5,0x29);
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '\0';
      }
    }
  }
  Fl_File_Browser::filter(this->fileList,this->pattern_);
  iVar3 = shown(this);
  if (iVar3 != 0) {
    rescan_keep_filename(this);
  }
  return;
}

Assistant:

void
Fl_File_Chooser::showChoiceCB()
{
  const char	*item,			// Selected item
		*patstart;		// Start of pattern
  char		*patend;		// End of pattern
  char		temp[FL_PATH_MAX];		// Temporary string for pattern


  item = showChoice->text(showChoice->value());

  if (strcmp(item, custom_filter_label) == 0) {
    if ((item = fl_input("%s", pattern_, custom_filter_label)) != NULL) {
      strlcpy(pattern_, item, sizeof(pattern_));

      quote_pathname(temp, item, sizeof(temp));
      showChoice->add(temp);
      showChoice->value(showChoice->size() - 2);
    }
  } else if ((patstart = strchr(item, '(')) == NULL) {
    strlcpy(pattern_, item, sizeof(pattern_));
  } else {
    strlcpy(pattern_, patstart + 1, sizeof(pattern_));
    if ((patend = strrchr(pattern_, ')')) != NULL) *patend = '\0';
  }

  fileList->filter(pattern_);

  if (shown()) {
    // Rescan the directory...
    rescan_keep_filename();
  }
}